

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

Aig_Man_t *
LivenessToSafetyTransformationOneStepLoop
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  int loCopied;
  int liCopied;
  int piCopied;
  char *nodeName;
  Aig_Obj_t *collectiveAssumeSafety;
  Aig_Obj_t *collectiveAssertSafety;
  Aig_Obj_t *pArgument;
  Aig_Obj_t *pObjCorrespondingLi;
  Aig_Obj_t *pDriverImage;
  Aig_Obj_t *pObjSafetyPropertyOutput;
  Aig_Obj_t *pObjSafetyGate;
  Aig_Obj_t *pObjFair;
  Aig_Obj_t *pObjLive;
  Aig_Obj_t *pObjAndAccDummy;
  Aig_Obj_t *pObjAndAcc;
  Aig_Obj_t *pObjXnor;
  Aig_Obj_t *pObjXor;
  Aig_Obj_t *pObjSavedLoAndEquality;
  Aig_Obj_t *pMatch;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObjSavePi;
  int nRegCount;
  int i;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vAssertSafety_local;
  Vec_Ptr_t *vFair_local;
  Vec_Ptr_t *vLive_local;
  Aig_Man_t *p_local;
  Abc_Ntk_t *pNtk_local;
  Aig_Man_t *pAStack_10;
  int mode_local;
  
  pObj = (Aig_Obj_t *)0x0;
  pDriverImage = (Aig_Obj_t *)0x0;
  iVar2 = Aig_ManRegNum(p);
  if (iVar2 == 0) {
    printf("The input AIG contains no register, returning the original AIG as it is\n");
    pAStack_10 = p;
  }
  else {
    iVar2 = Saig_ManPiNum(p);
    vecPis = Vec_PtrAlloc(iVar2 + 1);
    iVar2 = Saig_ManPiNum(p);
    vecPiNames = Vec_PtrAlloc(iVar2 + 1);
    iVar2 = Saig_ManRegNum(p);
    iVar3 = Vec_PtrSize(vLive);
    iVar4 = Vec_PtrSize(vFair);
    vecLos = Vec_PtrAlloc(iVar2 * 2 + 1 + iVar3 + iVar4);
    iVar2 = Saig_ManRegNum(p);
    iVar3 = Vec_PtrSize(vLive);
    iVar4 = Vec_PtrSize(vFair);
    vecLoNames = Vec_PtrAlloc(iVar2 * 2 + 1 + iVar3 + iVar4);
    iVar2 = Aig_ManObjNumMax(p);
    pAStack_10 = Aig_ManStart(iVar2 << 1);
    pcVar5 = Abc_UtilStrsav("live2safe");
    pAStack_10->pName = pcVar5;
    pAStack_10->pSpec = (char *)0x0;
    pMatch = Aig_ManConst1(p);
    pAVar6 = Aig_ManConst1(pAStack_10);
    (pMatch->field_5).pData = pAVar6;
    for (pObjSavePi._4_4_ = 0; iVar2 = Saig_ManPiNum(p), pObjSavePi._4_4_ < iVar2;
        pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
      pMatch = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,pObjSavePi._4_4_);
      pAVar6 = Aig_ObjCreateCi(pAStack_10);
      (pMatch->field_5).pData = pAVar6;
      Vec_PtrPush(vecPis,(pMatch->field_5).pData);
      pAVar7 = Abc_NtkPi(pNtk,pObjSavePi._4_4_);
      pcVar5 = Abc_ObjName(pAVar7);
      pcVar5 = Abc_UtilStrsav(pcVar5);
      Vec_PtrPush(vecPiNames,pcVar5);
    }
    if ((mode == 4) || (mode == 3)) {
      pObj = Aig_ObjCreateCi(pAStack_10);
      Vec_PtrPush(vecPiNames,"SAVE_BIERE");
    }
    for (pObjSavePi._4_4_ = 0; iVar2 = Saig_ManRegNum(p), pObjSavePi._4_4_ < iVar2;
        pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
      pVVar1 = p->vCis;
      iVar2 = Saig_ManPiNum(p);
      pMatch = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,pObjSavePi._4_4_ + iVar2);
      pAVar6 = Aig_ObjCreateCi(pAStack_10);
      (pMatch->field_5).pData = pAVar6;
      Vec_PtrPush(vecLos,(pMatch->field_5).pData);
      iVar2 = Abc_NtkPiNum(pNtk);
      pAVar7 = Abc_NtkCi(pNtk,iVar2 + pObjSavePi._4_4_);
      pcVar5 = Abc_ObjName(pAVar7);
      pcVar5 = Abc_UtilStrsav(pcVar5);
      Vec_PtrPush(vecLoNames,pcVar5);
    }
    for (pObjSavePi._4_4_ = 0; iVar2 = Vec_PtrSize(p->vObjs), pObjSavePi._4_4_ < iVar2;
        pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
      pMatch = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,pObjSavePi._4_4_);
      if ((pMatch != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pMatch), iVar2 != 0)) {
        pAVar6 = Aig_ObjChild0Copy(pMatch);
        pAVar9 = Aig_ObjChild1Copy(pMatch);
        pAVar6 = Aig_And(pAStack_10,pAVar6,pAVar9);
        (pMatch->field_5).pData = pAVar6;
      }
    }
    if ((mode == 4) || (mode == 1)) {
      iVar2 = Vec_PtrSize(vAssertSafety);
      if ((iVar2 == 0) || (iVar2 = Vec_PtrSize(vAssumeSafety), iVar2 != 0)) {
        iVar2 = Vec_PtrSize(vAssertSafety);
        if ((iVar2 == 0) || (iVar2 = Vec_PtrSize(vAssumeSafety), iVar2 == 0)) {
          printf("No safety property is specified, hence no safety gate is created\n");
        }
        else {
          pObjAndAccDummy = (Aig_Obj_t *)0x0;
          for (pObjSavePi._4_4_ = 0; pAVar6 = pObjAndAccDummy, iVar2 = Vec_PtrSize(vAssertSafety),
              pObjSavePi._4_4_ < iVar2; pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
            pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,pObjSavePi._4_4_);
            pAVar6 = Aig_ObjFanin0(pMatch);
            pAVar6 = (Aig_Obj_t *)(pAVar6->field_5).pData;
            iVar2 = Aig_ObjFaninC0(pMatch);
            pAVar6 = Aig_NotCond(pAVar6,iVar2);
            if (pObjAndAccDummy != (Aig_Obj_t *)0x0) {
              pAVar6 = Aig_And(pAStack_10,pAVar6,pObjAndAccDummy);
            }
            pObjAndAccDummy = pAVar6;
          }
          pObjAndAccDummy = (Aig_Obj_t *)0x0;
          for (pObjSavePi._4_4_ = 0; iVar2 = Vec_PtrSize(vAssumeSafety), pObjSavePi._4_4_ < iVar2;
              pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
            pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssumeSafety,pObjSavePi._4_4_);
            pAVar9 = Aig_ObjFanin0(pMatch);
            pAVar9 = (Aig_Obj_t *)(pAVar9->field_5).pData;
            iVar2 = Aig_ObjFaninC0(pMatch);
            pAVar9 = Aig_NotCond(pAVar9,iVar2);
            if (pObjAndAccDummy != (Aig_Obj_t *)0x0) {
              pAVar9 = Aig_And(pAStack_10,pAVar9,pObjAndAccDummy);
            }
            pObjAndAccDummy = pAVar9;
          }
          pAVar6 = Aig_Not(pAVar6);
          pAVar6 = Aig_And(pAStack_10,pAVar6,pObjAndAccDummy);
          Aig_ObjCreateCo(pAStack_10,pAVar6);
        }
      }
      else {
        pObjAndAccDummy = (Aig_Obj_t *)0x0;
        for (pObjSavePi._4_4_ = 0; iVar2 = Vec_PtrSize(vAssertSafety), pObjSavePi._4_4_ < iVar2;
            pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
          pMatch = (Aig_Obj_t *)Vec_PtrEntry(vAssertSafety,pObjSavePi._4_4_);
          pAVar6 = Aig_ObjFanin0(pMatch);
          pAVar6 = (Aig_Obj_t *)(pAVar6->field_5).pData;
          iVar2 = Aig_ObjFaninC0(pMatch);
          pAVar6 = Aig_NotCond(pAVar6,iVar2);
          if (pObjAndAccDummy != (Aig_Obj_t *)0x0) {
            pAVar6 = Aig_And(pAStack_10,pAVar6,pObjAndAccDummy);
          }
          pObjAndAccDummy = pAVar6;
        }
        pAVar6 = Aig_Not(pObjAndAccDummy);
        Aig_ObjCreateCo(pAStack_10,pAVar6);
      }
    }
    if ((mode == 4) || (mode == 3)) {
      pAVar6 = Aig_ObjFanin0(pMatch);
      pDriverImage = Aig_ObjCreateCo(pAStack_10,(Aig_Obj_t *)(pAVar6->field_5).pData);
    }
    pObjSavePi._0_4_ = 0;
    for (pObjSavePi._4_4_ = 0; iVar2 = Saig_ManRegNum(p), pObjSavePi._4_4_ < iVar2;
        pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
      pVVar1 = p->vCis;
      iVar2 = Saig_ManPiNum(p);
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,pObjSavePi._4_4_ + iVar2);
      pAVar9 = Saig_ObjLoToLi(p,pAVar6);
      pAVar6 = Aig_ObjFanin0(pAVar9);
      pAVar6 = (Aig_Obj_t *)(pAVar6->field_5).pData;
      iVar2 = Aig_ObjFaninC0(pAVar9);
      pAVar6 = Aig_NotCond(pAVar6,iVar2);
      Aig_ObjCreateCo(pAStack_10,pAVar6);
      pObjSavePi._0_4_ = (int)pObjSavePi + 1;
    }
    pObjAndAccDummy = (Aig_Obj_t *)0x0;
    if ((mode == 4) || (mode == 3)) {
      for (pObjSavePi._4_4_ = 0; iVar2 = Saig_ManRegNum(p), pObjSavePi._4_4_ < iVar2;
          pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
        pVVar1 = p->vCis;
        iVar2 = Saig_ManPiNum(p);
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,pObjSavePi._4_4_ + iVar2);
        pAVar8 = Saig_ObjLoToLi(p,pAVar6);
        pAVar6 = (Aig_Obj_t *)(pAVar6->field_5).pData;
        pAVar9 = Aig_ObjFanin0(pAVar8);
        pAVar9 = (Aig_Obj_t *)(pAVar9->field_5).pData;
        iVar2 = Aig_ObjFaninC0(pAVar8);
        pAVar9 = Aig_NotCond(pAVar9,iVar2);
        pAVar6 = Aig_Exor(pAStack_10,pAVar6,pAVar9);
        pAVar6 = Aig_Not(pAVar6);
        if (pObjAndAccDummy != (Aig_Obj_t *)0x0) {
          pAVar6 = Aig_And(pAStack_10,pAVar6,pObjAndAccDummy);
        }
        pObjAndAccDummy = pAVar6;
      }
      pAVar6 = Aig_And(pAStack_10,pObj,pObjAndAccDummy);
      pObjAndAccDummy = (Aig_Obj_t *)0x0;
      if ((vLive == (Vec_Ptr_t *)0x0) || (iVar2 = Vec_PtrSize(vLive), iVar2 == 0)) {
        printf("Circuit without any liveness property\n");
      }
      else {
        for (pObjSavePi._4_4_ = 0; iVar2 = Vec_PtrSize(vLive), pObjSavePi._4_4_ < iVar2;
            pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
          pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(vLive,pObjSavePi._4_4_);
          pAVar9 = Aig_ObjChild0(pAVar8);
          pAVar9 = Aig_Regular(pAVar9);
          pAVar9 = (Aig_Obj_t *)(pAVar9->field_5).pData;
          iVar2 = Aig_ObjFaninC0(pAVar8);
          pAVar9 = Aig_NotCond(pAVar9,iVar2);
          if (pObjAndAccDummy != (Aig_Obj_t *)0x0) {
            pAVar9 = Aig_And(pAStack_10,pAVar9,pObjAndAccDummy);
          }
          pObjAndAccDummy = pAVar9;
        }
      }
      if (pObjAndAccDummy == (Aig_Obj_t *)0x0) {
        pObjFair = Aig_ManConst1(pAStack_10);
      }
      else {
        pObjFair = pObjAndAccDummy;
      }
      pObjAndAccDummy = (Aig_Obj_t *)0x0;
      if ((vFair == (Vec_Ptr_t *)0x0) || (iVar2 = Vec_PtrSize(vFair), iVar2 == 0)) {
        printf("Circuit without any fairness property\n");
      }
      else {
        for (pObjSavePi._4_4_ = 0; iVar2 = Vec_PtrSize(vFair), pObjSavePi._4_4_ < iVar2;
            pObjSavePi._4_4_ = pObjSavePi._4_4_ + 1) {
          pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(vFair,pObjSavePi._4_4_);
          pAVar9 = Aig_ObjChild0(pAVar8);
          pAVar9 = Aig_Regular(pAVar9);
          pAVar9 = (Aig_Obj_t *)(pAVar9->field_5).pData;
          iVar2 = Aig_ObjFaninC0(pAVar8);
          pAVar9 = Aig_NotCond(pAVar9,iVar2);
          if (pObjAndAccDummy != (Aig_Obj_t *)0x0) {
            pAVar9 = Aig_And(pAStack_10,pAVar9,pObjAndAccDummy);
          }
          pObjAndAccDummy = pAVar9;
        }
      }
      if (pObjAndAccDummy == (Aig_Obj_t *)0x0) {
        pObjSafetyGate = Aig_ManConst1(pAStack_10);
      }
      else {
        pObjSafetyGate = pObjAndAccDummy;
      }
      pAVar9 = Aig_Not(pObjFair);
      pAVar9 = Aig_And(pAStack_10,pObjSafetyGate,pAVar9);
      pAVar6 = Aig_And(pAStack_10,pAVar6,pAVar9);
      Aig_ObjPatchFanin0(pAStack_10,pDriverImage,pAVar6);
    }
    Aig_ManSetRegNum(pAStack_10,(int)pObjSavePi);
    Aig_ManCiCleanupBiere(pAStack_10);
    Aig_ManCoCleanupBiere(pAStack_10);
    Aig_ManCleanup(pAStack_10);
    iVar2 = Aig_ManCheck(pAStack_10);
    if (iVar2 == 0) {
      __assert_fail("Aig_ManCheck( pNew )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                    ,0x470,
                    "Aig_Man_t *LivenessToSafetyTransformationOneStepLoop(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  return pAStack_10;
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationOneStepLoop( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
													  Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
	Aig_Man_t * pNew;
	int i, nRegCount;
	Aig_Obj_t * pObjSavePi = NULL;
	Aig_Obj_t *pObj, *pMatch;
	Aig_Obj_t *pObjSavedLoAndEquality;
	Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc, *pObjAndAccDummy;
	Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
	Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
	Aig_Obj_t *pDriverImage;
	Aig_Obj_t *pObjCorrespondingLi;
	Aig_Obj_t *pArgument;
	Aig_Obj_t *collectiveAssertSafety, *collectiveAssumeSafety;

	char *nodeName;
	int piCopied = 0, liCopied = 0, loCopied = 0;//, liCreated = 0, loCreated = 0, piVecIndex = 0;

	if( Aig_ManRegNum( p ) == 0 )
	{
		printf("The input AIG contains no register, returning the original AIG as it is\n");
		return p;
	}

	vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
	vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

	vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
	vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
	pNew->pName = Abc_UtilStrsav( "live2safe" );
    pNew->pSpec = NULL;
    
	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

	//****************************************************************
    // Step 3: create true PIs
	//****************************************************************
    Saig_ManForEachPi( p, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecPis, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
		Vec_PtrPush( vecPiNames, nodeName );
	}

	//****************************************************************
	// Step 4: create the special Pi corresponding to SAVE
	//****************************************************************
	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSavePi = Aig_ObjCreateCi( pNew );
		nodeName = "SAVE_BIERE",
		Vec_PtrPush( vecPiNames, nodeName );
	}
			
	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecLos, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
		Vec_PtrPush( vecLoNames, nodeName );
    }

	//****************************************************************
	// Step 6: create "saved" register output
	//****************************************************************

#if 0
	loCreated++;
	pObjSavedLo = Aig_ObjCreateCi( pNew );
	Vec_PtrPush( vecLos, pObjSavedLo );
	nodeName = "SAVED_LO";
	Vec_PtrPush( vecLoNames, nodeName );
#endif

	//****************************************************************
	// Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
	//****************************************************************
#if 0
	pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
	pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
#endif

	//********************************************************************
	// Step 8: create internal nodes
	//********************************************************************
    Aig_ManForEachNode( p, pObj, i )
	{
		pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

#if 0
	//********************************************************************
	// Step 8.x : create PO for each safety assertions
	//********************************************************************
	Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
	}
#endif

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
	{
		if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
		}
		else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssertSafety = pObjAndAcc;
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssumeSafety = pObjAndAcc;
			Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
		}
		else
			printf("No safety property is specified, hence no safety gate is created\n");
	}

	//********************************************************************
	// Step 9: create the safety property output gate
	// create the safety property output gate, this will be the sole true PO 
	// of the whole circuit, discuss with Sat/Alan for an alternative implementation
	//********************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
	}

	// create register inputs for the original registers
    nRegCount = 0;
	
	Saig_ManForEachLo( p, pObj, i )
    {
		pMatch = Saig_ObjLoToLi( p, pObj );
        //Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
		Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
        nRegCount++;
		liCopied++;
    }

#if 0
	// create register input corresponding to the register "saved"
	pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
	nRegCount++;
	liCreated++;7
#endif

	pObjAndAcc = NULL;

	//****************************************************************************************************
	//For detection of loop of length 1 we do not need any shadow register, we only need equality detector
	//between Lo_j and Li_j and then a cascade of AND gates
	//****************************************************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		Saig_ManForEachLo( p, pObj, i )
		{
			pObjCorrespondingLi = Saig_ObjLoToLi( p, pObj );
		
			pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData,  Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0( pObjCorrespondingLi )->pData, Aig_ObjFaninC0( pObjCorrespondingLi ) ) );
			pObjXnor = Aig_Not( pObjXor );
		
			if( pObjAndAcc == NULL )
				pObjAndAcc = pObjXnor;
			else
			{
				pObjAndAccDummy = pObjAndAcc;
				pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAccDummy );
			}
		}

		// create the AND gate whose output will be the signal "looped"
		pObjSavedLoAndEquality = Aig_And( pNew, pObjSavePi, pObjAndAcc );
	
		// create the master AND gate and corresponding AND and OR logic for the liveness properties
		pObjAndAcc = NULL;
		if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
			printf("Circuit without any liveness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjLive = pObjAndAcc;
		else
			pObjLive = Aig_ManConst1( pNew );
	
		// create the master AND gate and corresponding AND and OR logic for the fairness properties
		pObjAndAcc = NULL;
		if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
			printf("Circuit without any fairness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjFair = pObjAndAcc;
		else
			pObjFair = Aig_ManConst1( pNew );
	
		pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );
	
		Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
	}

	Aig_ManSetRegNum( pNew, nRegCount );

	//printf("\nSaig_ManPiNum = %d, Reg Num = %d, before everything, before Pi cleanup\n", Vec_PtrSize( pNew->vPis ), pNew->nRegs );

	Aig_ManCiCleanupBiere( pNew );
	Aig_ManCoCleanupBiere( pNew );

	Aig_ManCleanup( pNew );
	
	assert( Aig_ManCheck( pNew ) );
	
	return pNew;
}